

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMap
               (ValidPointersMapTable *validTable,InvalidBitsTable *invalidTable,
               BlockInfoMapTable *blockInfoTable)

{
  ushort *puVar1;
  SmallHeapBlockBitVector *pSVar2;
  BlockInfo *pBVar3;
  uint uVar4;
  Type *pTVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ushort *validInteriorPointers;
  BVIndex i;
  uint uVar9;
  uint k;
  long lVar10;
  ValidPointersMapRow *pauVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  long local_50;
  long local_48;
  long local_40;
  int local_38;
  
  if (validTable != (ValidPointersMapTable *)0x0) {
    memset(validTable,0xff,0xc000);
  }
  local_40 = 1;
  local_50 = 2;
  local_48 = 0x10;
  lVar7 = 0;
  while (lVar7 != 0x30) {
    puVar1 = *(ValidPointersMapRow *)(*validTable)[0] + 0x100;
    pTVar5 = (*invalidTable)[lVar7].data;
    *(undefined4 *)&pTVar5[2].word = 0xffffffff;
    *(undefined4 *)((long)&pTVar5[2].word + 4) = 0xffffffff;
    *(undefined4 *)&pTVar5[3].word = 0xffffffff;
    *(undefined4 *)((long)&pTVar5[3].word + 4) = 0xffffffff;
    pSVar2 = *invalidTable + lVar7;
    *(undefined4 *)&pSVar2->data[0].word = 0xffffffff;
    *(undefined4 *)((long)&pSVar2->data[0].word + 4) = 0xffffffff;
    *(undefined4 *)&pSVar2->data[1].word = 0xffffffff;
    *(undefined4 *)((long)&pSVar2->data[1].word + 4) = 0xffffffff;
    uVar4 = 0x1000 / ((int)lVar7 * 0x10 + 0x10U & 0xffff);
    pBVar3 = (*blockInfoTable)[lVar7];
    pBVar3->lastObjectIndexOnPage = 0;
    pBVar3->pageObjectCount = 0;
    pSVar2 = *invalidTable + lVar7;
    lVar7 = lVar7 + 1;
    uVar12 = 0;
    lVar10 = 0;
    uVar14 = 0;
    pauVar11 = *validTable;
    while( true ) {
      i = (BVIndex)lVar10;
      local_38 = (int)lVar7;
      if ((ushort)uVar4 <= uVar14) break;
      uVar13 = (ushort)uVar14;
      if (validTable != (ValidPointersMapTable *)0x0) {
        i = local_38 * (int)uVar14;
        (*(ValidPointersMapRow *)*pauVar11)[0] = uVar13;
      }
      uVar8 = uVar12 >> 0xc & 0xfffff;
      pBVar3[uVar8].pageObjectCount = pBVar3[uVar8].pageObjectCount + 1;
      if (uVar13 <= pBVar3[uVar8].lastObjectIndexOnPage) {
        uVar13 = pBVar3[uVar8].lastObjectIndexOnPage;
      }
      pBVar3[uVar8].lastObjectIndexOnPage = uVar13;
      BVStatic<256UL>::Clear(pSVar2,i);
      uVar14 = uVar14 + 1;
      lVar10 = lVar10 + local_40;
      pauVar11 = (ValidPointersMapRow *)((long)*(ValidPointersMapRow *)*pauVar11 + local_50);
      uVar12 = uVar12 + local_48;
    }
    if (puVar1 == (ushort *)0x0 || validTable == (ValidPointersMapTable *)0x0) {
      validTable = (ValidPointersMapTable *)0x0;
    }
    else {
      uVar12 = 0;
      uVar6 = 0;
      while (uVar6 < uVar4) {
        uVar9 = (uVar6 + 1) * local_38;
        if (0xff < uVar9) {
          uVar9 = 0x100;
        }
        for (uVar14 = uVar12; uVar14 < uVar9; uVar14 = uVar14 + 1) {
          puVar1[uVar14] = (ushort)uVar6;
        }
        uVar12 = uVar12 + local_40;
        uVar6 = uVar6 + 1;
      }
      validTable = (ValidPointersMapTable *)((long)validTable + 0x400);
    }
    local_40 = local_40 + 1;
    local_50 = local_50 + 2;
    local_48 = local_48 + 0x10;
  }
  return;
}

Assistant:

void HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMap(ValidPointersMapTable * validTable, InvalidBitsTable& invalidTable, BlockInfoMapTable& blockInfoTable)
{
    // Create the valid pointer map to be shared by the buckets.
    // Also create the invalid objects bit vector.
    ushort * buffer = &((*validTable)[0][0]);
    if (buffer)
    {
        memset(buffer, -1, sizeof(ushort) * 2 * TBlockAttributes::MaxSmallObjectCount * TBlockAttributes::BucketCount);
    }

    for (uint i = 0; i < TBlockAttributes::BucketCount; i++)
    {
        // Non-interior first
        ushort * validPointers = buffer;
        if (buffer)
        {            
            buffer += TBlockAttributes::MaxSmallObjectCount;
        }

        typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector * invalidBitVector = &invalidTable[i];
        invalidBitVector->SetAll();

        uint bucketSize;

        if (TBlockAttributes::IsSmallBlock)
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * i;
        }
        else
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (i + 1);
        }

        uint stride = bucketSize / HeapConstants::ObjectGranularity;
        uint maxObjectCountForBucket = ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize);

        BlockInfoMapRow* blockInfoRow = &blockInfoTable[i];

        memset(blockInfoRow, 0, sizeof(BlockInfoMapRow));

        for (ushort j = 0; j < maxObjectCountForBucket; j++)
        {
            if (validPointers)
            {
                validPointers[j * stride] = j;
            }

            uintptr_t objectAddress = j * bucketSize;
            Assert(objectAddress / AutoSystemInfo::PageSize < USHRT_MAX);
            ushort pageIndex = (ushort)(objectAddress / AutoSystemInfo::PageSize);

            (*blockInfoRow)[pageIndex].pageObjectCount++;
            (*blockInfoRow)[pageIndex].lastObjectIndexOnPage = max(j, (*blockInfoRow)[pageIndex].lastObjectIndexOnPage);

            invalidBitVector->Clear(j * stride);
        }

        if (buffer)
        {
            // interior pointer
            ushort * validInteriorPointers = buffer;
            buffer += TBlockAttributes::MaxSmallObjectCount;
            for (ushort j = 0; j < maxObjectCountForBucket; j++)
            {
                uint start = j * stride;
                uint end = min(start + stride, TBlockAttributes::MaxSmallObjectCount);
                for (uint k = start; k < end; k++)
                {
                    validInteriorPointers[k] = j;
                }
            }
        }
    }
}